

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int stateResortCompare(void *a,void *b)

{
  long lVar1;
  long lVar2;
  int n;
  state *pB;
  state *pA;
  void *b_local;
  void *a_local;
  
  lVar1 = *a;
  lVar2 = *b;
  n = *(int *)(lVar2 + 0x24) - *(int *)(lVar1 + 0x24);
  if ((n == 0) && (n = *(int *)(lVar2 + 0x20) - *(int *)(lVar1 + 0x20), n == 0)) {
    n = *(int *)(lVar2 + 0x10) - *(int *)(lVar1 + 0x10);
  }
  return n;
}

Assistant:

static int stateResortCompare(const void *a, const void *b){
  const struct state *pA = *(const struct state**)a;
  const struct state *pB = *(const struct state**)b;
  int n;

  n = pB->nNtAct - pA->nNtAct;
  if( n==0 ){
    n = pB->nTknAct - pA->nTknAct;
    if( n==0 ){
      n = pB->statenum - pA->statenum;
    }
  }
  assert( n!=0 );
  return n;
}